

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testMethod_compare(void)

{
  undefined1 *puVar1;
  element_type *peVar2;
  string_view *this;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  undefined1 *puVar8;
  ostream *poVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  size_type __rlen;
  difference_type __diff;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string_view sVar15;
  String str;
  undefined1 local_68 [32];
  String local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_compare()\n",0x15);
  cm::String::String<char_const(&)[2],void>(&local_48,(char (*) [2])0x921655);
  sVar5 = local_48.view_._M_len;
  uVar12 = (ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar8 = (undefined1 *)0x0;
  }
  else {
    uVar6 = memcmp(local_48.view_._M_str,"a",uVar12);
    puVar8 = (undefined1 *)(ulong)uVar6;
  }
  if ((int)puVar8 == 0) {
    puVar1 = (undefined1 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar5 + -0x10))->
                     _M_weak_count + 3);
    puVar8 = (undefined1 *)0xffffffff80000000;
    if (-0x80000000 < (long)puVar1) {
      puVar8 = puVar1;
    }
    if (0x7ffffffe < (long)puVar8) {
      puVar8 = (undefined1 *)0x7fffffff;
    }
  }
  if ((int)puVar8 < 1) {
    iVar7 = 0x368;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"a\") > 0) failed on line ",0x31);
LAB_001c85e1:
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  else {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar14 = true;
    }
    else {
      iVar7 = bcmp(local_48.view_._M_str,"b",uVar12);
      bVar14 = iVar7 == 0;
    }
    if (!(bool)(bVar14 & (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001)) {
      iVar7 = 0x369;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"b\") == 0) failed on line ",0x32);
      goto LAB_001c85e1;
    }
    iVar7 = memcmp(local_48.view_._M_str,"c",uVar12);
    if (-1 < iVar7) {
      iVar7 = 0x36a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"c\") < 0) failed on line ",0x31);
      goto LAB_001c85e1;
    }
    if ((byte)*local_48.view_._M_str < 0x62) {
      iVar7 = 0x36f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(a) > 0) failed on line ",0x2f);
    }
    else if (*local_48.view_._M_str == 0x62 &&
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001) {
      if ((byte)*local_48.view_._M_str < 99) {
        local_68[0] = 0x61;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = memcmp(local_48.view_._M_str,local_68,uVar12);
          if (0 < iVar7) {
            local_68[0] = 0x62;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar14 = true;
            }
            else {
              iVar7 = bcmp(local_48.view_._M_str,local_68,uVar12);
              bVar14 = iVar7 == 0;
            }
            if ((bool)(bVar14 & (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001)) {
              local_68[0] = 99;
              iVar7 = memcmp(local_48.view_._M_str,local_68,uVar12);
              if (iVar7 < 0) {
                peVar2 = (element_type *)(local_68 + 0x10);
                local_68._0_8_ = peVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a","");
                uVar3 = local_68._0_8_;
                uVar12 = local_48.view_._M_len - local_68._8_8_;
                p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
                if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len;
                }
                if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  uVar13 = 0;
                }
                else {
                  uVar6 = memcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var11);
                  uVar13 = (ulong)uVar6;
                }
                if ((int)uVar13 == 0) {
                  uVar13 = 0xffffffff80000000;
                  if (-0x80000000 < (long)uVar12) {
                    uVar13 = uVar12;
                  }
                  if (0x7ffffffe < (long)uVar13) {
                    uVar13 = 0x7fffffff;
                  }
                }
                if ((element_type *)uVar3 != peVar2) {
                  operator_delete((void *)uVar3,local_68._16_8_ + 1);
                }
                if ((int)uVar13 < 1) {
                  iVar7 = 0x376;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(str.compare(std::string(\"a\")) > 0) failed on line ",0x3e
                            );
                }
                else {
                  local_68._0_8_ = peVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"b","");
                  sVar5 = local_48.view_._M_len;
                  uVar4 = local_68._8_8_;
                  uVar3 = local_68._0_8_;
                  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
                  if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len;
                  }
                  if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    iVar7 = bcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var11);
                    bVar14 = iVar7 == 0;
                  }
                  if ((element_type *)uVar3 != peVar2) {
                    operator_delete((void *)uVar3,local_68._16_8_ + 1);
                  }
                  if ((bool)(sVar5 == uVar4 & bVar14)) {
                    local_68._0_8_ = peVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"c","");
                    uVar3 = local_68._0_8_;
                    uVar12 = local_48.view_._M_len - local_68._8_8_;
                    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
                    if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                local_48.view_._M_len;
                    }
                    if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      uVar13 = 0;
                    }
                    else {
                      uVar6 = memcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var11);
                      uVar13 = (ulong)uVar6;
                    }
                    if ((int)uVar13 == 0) {
                      uVar13 = 0xffffffff80000000;
                      if (-0x80000000 < (long)uVar12) {
                        uVar13 = uVar12;
                      }
                      if (0x7ffffffe < (long)uVar13) {
                        uVar13 = 0x7fffffff;
                      }
                    }
                    if ((element_type *)uVar3 != peVar2) {
                      operator_delete((void *)uVar3,local_68._16_8_ + 1);
                    }
                    sVar5 = local_48.view_._M_len;
                    if ((int)uVar13 < 0) {
                      uVar12 = (ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_48.view_._M_len !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len ==
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        puVar8 = (undefined1 *)0x0;
                      }
                      else {
                        uVar6 = memcmp(local_48.view_._M_str,"a_",uVar12);
                        puVar8 = (undefined1 *)(ulong)uVar6;
                      }
                      if ((int)puVar8 == 0) {
                        puVar1 = (undefined1 *)
                                 ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         (sVar5 + -0x10))->_M_weak_count + 3);
                        puVar8 = (undefined1 *)0xffffffff80000000;
                        if (-0x80000000 < (long)puVar1) {
                          puVar8 = puVar1;
                        }
                        if (0x7ffffffe < (long)puVar8) {
                          puVar8 = (undefined1 *)0x7fffffff;
                        }
                      }
                      if ((int)puVar8 < 1) {
                        iVar7 = 0x379;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(str.compare(cm::string_view(\"a_\", 1)) > 0) failed on line "
                                   ,0x46);
                      }
                      else {
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          bVar14 = true;
                        }
                        else {
                          iVar7 = bcmp(local_48.view_._M_str,"b_",uVar12);
                          bVar14 = iVar7 == 0;
                        }
                        if ((bool)(bVar14 & (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            &DAT_00000001)) {
                          iVar7 = memcmp(local_48.view_._M_str,"c_",uVar12);
                          if (iVar7 < 0) {
                            cm::String::String<char_const(&)[2],void>
                                      ((String *)local_68,(char (*) [2])0x90e1d0);
                            sVar15 = cm::AsStringView<cm::String>::view((String *)local_68);
                            sVar5 = local_48.view_._M_len;
                            p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar15._M_len;
                            p_Var11 = p_Var10;
                            if (local_48.view_._M_len < p_Var10) {
                              p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_48.view_._M_len;
                            }
                            if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              uVar12 = 0;
                            }
                            else {
                              uVar6 = memcmp(local_48.view_._M_str,sVar15._M_str,(size_t)p_Var11);
                              uVar12 = (ulong)uVar6;
                            }
                            if ((int)uVar12 == 0) {
                              uVar12 = 0xffffffff80000000;
                              if (-0x80000000 < (long)(sVar5 - (long)p_Var10)) {
                                uVar12 = sVar5 - (long)p_Var10;
                              }
                              if (0x7ffffffe < (long)uVar12) {
                                uVar12 = 0x7fffffff;
                              }
                            }
                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_68._8_8_);
                            }
                            if ((int)uVar12 < 1) {
                              iVar7 = 0x37c;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(str.compare(cm::String(\"a\")) > 0) failed on line "
                                         ,0x3d);
                            }
                            else {
                              cm::String::String<char_const(&)[2],void>
                                        ((String *)local_68,(char (*) [2])0x921655);
                              sVar15 = cm::AsStringView<cm::String>::view((String *)local_68);
                              sVar5 = local_48.view_._M_len;
                              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        sVar15._M_len;
                              p_Var11 = p_Var10;
                              if (local_48.view_._M_len < p_Var10) {
                                p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          local_48.view_._M_len;
                              }
                              if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                bVar14 = true;
                              }
                              else {
                                iVar7 = bcmp(local_48.view_._M_str,sVar15._M_str,(size_t)p_Var11);
                                bVar14 = iVar7 == 0;
                              }
                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           local_68._8_8_);
                              }
                              if ((bool)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5 ==
                                         p_Var10 & bVar14)) {
                                cm::String::String<char_const(&)[2],void>
                                          ((String *)local_68,(char (*) [2])0x993621);
                                sVar15 = cm::AsStringView<cm::String>::view((String *)local_68);
                                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          sVar15._M_len;
                                p_Var11 = p_Var10;
                                if (local_48.view_._M_len < p_Var10) {
                                  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            local_48.view_._M_len;
                                }
                                if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  uVar12 = 0;
                                }
                                else {
                                  uVar6 = memcmp(local_48.view_._M_str,sVar15._M_str,(size_t)p_Var11
                                                );
                                  uVar12 = (ulong)uVar6;
                                }
                                if ((int)uVar12 == 0) {
                                  uVar12 = 0xffffffff80000000;
                                  if (-0x80000000 < (long)(local_48.view_._M_len - (long)p_Var10)) {
                                    uVar12 = local_48.view_._M_len - (long)p_Var10;
                                  }
                                  if (0x7ffffffe < (long)uVar12) {
                                    uVar12 = 0x7fffffff;
                                  }
                                }
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_
                                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                             local_68._8_8_);
                                }
                                if ((int)uVar12 < 0) {
                                  this = &local_48.view_;
                                  __str._M_str = "a";
                                  __str._M_len = 1;
                                  iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::
                                          compare(this,0,1,__str);
                                  if (iVar7 < 1) {
                                    iVar7 = 0x37f;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE(str.compare(0, 1, cm::string_view(\"a\", 1)) > 0) failed on line "
                                               ,0x4b);
                                  }
                                  else {
                                    iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::
                                            compare(this,1,0,(
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  (ZEXT816(0x9ac4f5) << 0x40));
                                    if (iVar7 == 0) {
                                      __str_00._M_str = "ac";
                                      __str_00._M_len = 2;
                                      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>
                                              ::compare(this,0,1,__str_00,1,1);
                                      if (iVar7 < 0) {
                                        iVar7 = std::
                                                basic_string_view<char,_std::char_traits<char>_>::
                                                compare(this,1,0,"");
                                        if (iVar7 == 0) {
                                          iVar7 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  compare(this,1,0,"_",0);
                                          if (iVar7 == 0) {
                                            bVar14 = true;
                                            goto LAB_001c8605;
                                          }
                                          iVar7 = 899;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(str.compare(1, 0, \"_\", 0) == 0) failed on line "
                                                  ,0x3b);
                                        }
                                        else {
                                          iVar7 = 0x382;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(str.compare(1, 0, \"\") == 0) failed on line "
                                                  ,0x37);
                                        }
                                      }
                                      else {
                                        iVar7 = 0x381;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(str.compare(0, 1, cm::string_view(\"ac\", 2), 1, 1) < 0) failed on line "
                                                  ,0x52);
                                      }
                                    }
                                    else {
                                      iVar7 = 0x380;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "ASSERT_TRUE(str.compare(1, 0, cm::string_view(\"\", 0)) == 0) failed on line "
                                                 ,0x4b);
                                    }
                                  }
                                }
                                else {
                                  iVar7 = 0x37e;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(str.compare(cm::String(\"c\")) < 0) failed on line "
                                             ,0x3d);
                                }
                              }
                              else {
                                iVar7 = 0x37d;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(str.compare(cm::String(\"b\")) == 0) failed on line "
                                           ,0x3e);
                              }
                            }
                          }
                          else {
                            iVar7 = 0x37b;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(str.compare(cm::string_view(\"c_\", 1)) < 0) failed on line "
                                       ,0x46);
                          }
                        }
                        else {
                          iVar7 = 0x37a;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(str.compare(cm::string_view(\"b_\", 1)) == 0) failed on line "
                                     ,0x47);
                        }
                      }
                    }
                    else {
                      iVar7 = 0x378;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(str.compare(std::string(\"c\")) < 0) failed on line ",
                                 0x3e);
                    }
                  }
                  else {
                    iVar7 = 0x377;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(str.compare(std::string(\"b\")) == 0) failed on line ",
                               0x3f);
                  }
                }
              }
              else {
                iVar7 = 0x375;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(str.compare(\'c\') < 0) failed on line ",0x31);
              }
            }
            else {
              iVar7 = 0x374;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(str.compare(\'b\') == 0) failed on line ",0x32);
            }
            goto LAB_001c85e1;
          }
        }
        iVar7 = 0x373;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\'a\') > 0) failed on line ",0x31)
        ;
        goto LAB_001c85e1;
      }
      iVar7 = 0x371;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(c) < 0) failed on line ",0x2f);
    }
    else {
      iVar7 = 0x370;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(b) == 0) failed on line ",0x30);
    }
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  bVar14 = false;
LAB_001c8605:
  if (local_48.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar14;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}